

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

ISPCCamera * __thiscall
embree::Camera::getISPCCamera
          (ISPCCamera *__return_storage_ptr__,Camera *this,size_t width,size_t height)

{
  float fVar1;
  float fVar2;
  float fVar3;
  AffineSpace3fa local2world;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_58;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  fVar1 = tanf(this->fov * 0.5 * 0.017453292);
  camera2world((AffineSpace3fa *)&local_98.field_1,this);
  fVar2 = (float)width * -0.5;
  fStack_4c = -local_88;
  local_48 = -fStack_84;
  fStack_44 = -fStack_80;
  fVar3 = (float)height * 0.5;
  fVar1 = fVar3 * (1.0 / fVar1);
  fStack_40 = fVar1 * local_78 + fVar2 * local_98.m128[0] + fVar3 * local_88;
  fStack_3c = fVar1 * fStack_74 + fVar2 * local_98.m128[1] + fVar3 * fStack_84;
  local_38 = fVar1 * fStack_70 + fVar2 * local_98.m128[2] + fVar3 * fStack_80;
  local_58.field_0.x = local_98.m128[0];
  local_58.field_0.y = local_98.m128[1];
  local_58.field_0.z = local_98.m128[2];
  uStack_34 = local_68;
  uStack_30 = uStack_64;
  uStack_2c = uStack_60;
  ISPCCamera::ISPCCamera(__return_storage_ptr__,(AffineSpace3f *)&local_58.field_0);
  return __return_storage_ptr__;
}

Assistant:

ISPCCamera getISPCCamera (size_t width, size_t height)
    {
      const float fovScale = 1.0f/tanf(deg2rad(0.5f*fov));
      const AffineSpace3fa local2world = camera2world();
      Vec3fa vx = local2world.l.vx;
      Vec3fa vy = -local2world.l.vy;
      Vec3fa vz = -0.5f*width*local2world.l.vx + 0.5f*height*local2world.l.vy + 0.5f*height*fovScale*local2world.l.vz;
      Vec3fa p =  local2world.p;
      return ISPCCamera(AffineSpace3f(vx,vy,vz,p));
    }